

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldTypes.h
# Opt level: O2

void __thiscall
FIX::DateTime::DateTime
          (DateTime *this,int year,int month,int day,int hour,int minute,int second,int fraction,
          int precision)

{
  int iVar1;
  
  this->_vptr_DateTime = (_func_int **)&PTR__DateTime_00322540;
  iVar1 = julianDate(year,month,day);
  this->m_date = iVar1;
  iVar1 = convertToNanos(fraction,precision);
  this->m_time = (long)iVar1 +
                 ((long)minute * 0x3c + (long)hour * 0xe10 + (long)second) * 1000000000;
  return;
}

Assistant:

DateTime( int year, int month, int day,
            int hour, int minute, int second, int fraction, int precision )
  {
    m_date = julianDate( year, month, day );
    int nanos = convertToNanos(fraction, precision);
    m_time = makeHMS( hour, minute, second, nanos );
  }